

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void kratos::hash_generator_name(Context *context,Generator *generator)

{
  void *key;
  uint64_t uVar1;
  uint64_t hash;
  string *name;
  Generator *generator_local;
  Context *context_local;
  
  key = (void *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::size();
  uVar1 = hash_64_fnv1a(key,uVar1);
  Context::add_hash(context,generator,uVar1);
  return;
}

Assistant:

void hash_generator_name(Context* context, Generator* generator) {
    auto const& name = generator->name;
    uint64_t hash = hash_64_fnv1a(name.c_str(), name.size());
    context->add_hash(generator, hash);
}